

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void removeDataBefore(Box<objectbox::tsdemo::SensorValues> box,int64_t time)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  uint64_t uVar3;
  QueryBuilder<objectbox::tsdemo::SensorValues> *this;
  StopWatch local_a8 [4];
  QueryBase local_88;
  ulong local_70;
  size_t removeCount;
  StopWatch stopWatch;
  QCInt64 local_50;
  undefined1 local_30 [8];
  QueryBuilder<objectbox::tsdemo::SensorValues> queryBuilder;
  int64_t time_local;
  
  queryBuilder.super_QueryBuilderBase._24_8_ = time;
  obx::Box<objectbox::tsdemo::SensorValues>::query
            ((QueryBuilder<objectbox::tsdemo::SensorValues> *)local_30,
             (Box<objectbox::tsdemo::SensorValues> *)&box.super_BoxTypeless);
  obx::Property<objectbox::tsdemo::SensorValues,(OBXPropertyType)10>::
  lessThan<(OBXPropertyType)10,void>
            (&local_50,&objectbox::tsdemo::SensorValues_::time,
             queryBuilder.super_QueryBuilderBase._24_8_);
  obx::QueryBuilder<objectbox::tsdemo::SensorValues>::with
            ((QueryBuilder<objectbox::tsdemo::SensorValues> *)local_30,(QueryCondition *)&local_50);
  obx::anon_unknown_3::QCInt64::~QCInt64(&local_50);
  objectbox::StopWatch::StopWatch((StopWatch *)&removeCount);
  this = (QueryBuilder<objectbox::tsdemo::SensorValues> *)local_30;
  obx::QueryBuilder<objectbox::tsdemo::SensorValues>::build
            ((Query<objectbox::tsdemo::SensorValues> *)&local_88,this);
  iVar1 = obx::QueryBase::remove(&local_88,(char *)this);
  obx::Query<objectbox::tsdemo::SensorValues>::~Query
            ((Query<objectbox::tsdemo::SensorValues> *)&local_88);
  local_70 = CONCAT44(extraout_var,iVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"Removed old objects in ");
  objectbox::StopWatch::durationForLog_abi_cxx11_(local_a8);
  poVar2 = std::operator<<(poVar2,(string *)local_a8);
  poVar2 = std::operator<<(poVar2," (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_70);
  poVar2 = std::operator<<(poVar2," objects)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_a8);
  poVar2 = std::operator<<((ostream *)&std::cout,"Total objects in DB: ");
  uVar3 = obx::BoxTypeless::count(&box.super_BoxTypeless,0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  obx::QueryBuilder<objectbox::tsdemo::SensorValues>::~QueryBuilder
            ((QueryBuilder<objectbox::tsdemo::SensorValues> *)local_30);
  return;
}

Assistant:

void removeDataBefore(obx::Box<SensorValues> box, int64_t time) {
    obx::QueryBuilder<SensorValues> queryBuilder = box.query();
    queryBuilder.with(SensorValues_::time.lessThan(time));
    StopWatch stopWatch;
    size_t removeCount = queryBuilder.build().remove();
    std::cout << "Removed old objects in " << stopWatch.durationForLog() << " (" << removeCount << " objects)"
              << std::endl;

    std::cout << "Total objects in DB: " << box.count() << std::endl;
}